

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O3

int mpq_cmp_ui(__mpq_struct *q,unsigned_long n,unsigned_long d)

{
  int iVar1;
  mp_limb_t dl;
  mp_limb_t nl;
  mpq_t t;
  unsigned_long local_38;
  unsigned_long local_30;
  __mpq_struct local_28;
  
  local_28._mp_den._mp_d = &local_38;
  local_28._mp_num._mp_d = &local_30;
  local_28._mp_num._mp_alloc = 0;
  local_28._mp_num._mp_size = (int)(n != 0);
  local_28._mp_den._mp_alloc = 0;
  local_28._mp_den._mp_size = 1;
  local_38 = d;
  local_30 = n;
  iVar1 = mpq_cmp(q,&local_28);
  return iVar1;
}

Assistant:

int
mpq_cmp_ui (const mpq_t q, unsigned long n, unsigned long d)
{
  mpq_t t;
  assert (d != 0);
  if (ULONG_MAX <= GMP_LIMB_MAX) {
    mp_limb_t nl = n, dl = d;
    return mpq_cmp (q, mpq_roinit_normal_nn (t, &nl, n != 0, &dl, 1));
  } else {
    int ret;

    mpq_nan_init (t);
    mpq_set_ui (t, n, d);
    ret = mpq_cmp (q, t);
    mpq_clear (t);

    return ret;
  }
}